

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_subs_s_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  long local_48;
  long local_40;
  int64_t min_int;
  int64_t max_int;
  int64_t arg2_local;
  int64_t arg1_local;
  long lStack_10;
  uint32_t df_local;
  
  local_48 = (1L << ((char)(1L << ((char)df + 3U & 0x3f)) - 1U & 0x3f)) + -1;
  local_40 = -(1L << ((char)(1L << ((char)df + 3U & 0x3f)) - 1U & 0x3f));
  if (arg2 < 1) {
    if (arg1 < local_48 + arg2) {
      local_48 = arg1 - arg2;
    }
    lStack_10 = local_48;
  }
  else {
    if (local_40 + arg2 < arg1) {
      local_40 = arg1 - arg2;
    }
    lStack_10 = local_40;
  }
  return lStack_10;
}

Assistant:

static inline int64_t msa_subs_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (arg2 > 0) {
        return (min_int + arg2 < arg1) ? arg1 - arg2 : min_int;
    } else {
        return (arg1 < max_int + arg2) ? arg1 - arg2 : max_int;
    }
}